

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_code_segment_info(code_segment sec)

{
  vec *instructions;
  code_pointer paVar1;
  ulong uVar2;
  
  paVar1 = sec.code_segment_addr;
  for (uVar2 = 0; instructions = &paVar1->inst, sec.code_segment_count != uVar2; uVar2 = uVar2 + 1)
  {
    printf("  - code[%d]: size=%lu\n",uVar2 & 0xffffffff,
           *(undefined8 *)((long)(instructions + -1) + 0x48));
    print_instructions(instructions,0,false);
    paVar1 = (code_pointer)(instructions + 1);
  }
  return;
}

Assistant:

void print_code_segment_info(code_segment sec) {
    code_pointer code_segment_addr;
    for (int i = 0; i < sec.code_segment_count; ++i) {
        code_segment_addr = sec.code_segment_addr + i;
        printf("  - code[%d]: size=%lu\n", i, code_segment_addr->code_size);
#ifdef PRINT_CODE
        print_instructions(&code_segment_addr->inst, 0, false);
#endif
    }
}